

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O1

void __thiscall FIWadManager::ClearChecks(FIWadManager *this)

{
  int *piVar1;
  ulong uVar2;
  
  TArray<int,_int>::Resize(&this->mLumpsFound,(this->mIWads).Count);
  if ((this->mLumpsFound).Count != 0) {
    piVar1 = (this->mLumpsFound).Array;
    uVar2 = 0;
    do {
      piVar1[uVar2] = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->mLumpsFound).Count);
  }
  return;
}

Assistant:

void FIWadManager::ClearChecks()
{
	mLumpsFound.Resize(mIWads.Size());
	for(unsigned i=0;i<mLumpsFound.Size(); i++)
	{
		mLumpsFound[i] = 0;
	}
}